

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charstr.cpp
# Opt level: O0

CharString * __thiscall
icu_63::CharString::ensureEndsWithFileSeparator(CharString *this,UErrorCode *errorCode)

{
  UBool UVar1;
  char *pcVar2;
  char c;
  UErrorCode *errorCode_local;
  CharString *this_local;
  
  UVar1 = ::U_SUCCESS(*errorCode);
  if ((UVar1 != '\0') && (0 < this->len)) {
    pcVar2 = MaybeStackArray<char,_40>::operator[](&this->buffer,(long)(this->len + -1));
    if ((*pcVar2 != '/') && (*pcVar2 != '/')) {
      append(this,'/',errorCode);
    }
  }
  return this;
}

Assistant:

CharString &CharString::ensureEndsWithFileSeparator(UErrorCode &errorCode) {
    char c;
    if(U_SUCCESS(errorCode) && len>0 &&
            (c=buffer[len-1])!=U_FILE_SEP_CHAR && c!=U_FILE_ALT_SEP_CHAR) {
        append(U_FILE_SEP_CHAR, errorCode);
    }
    return *this;
}